

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>
::
ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,SparsityPrinter>
           *this)

{
  BinaryReaderBase *this_00;
  int iVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                    (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if (*(int *)(*(long *)(this + 8) + 4) < iVar1) {
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x13a083,&local_20);
  }
  if (0 < iVar1) {
    do {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>::
      ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_SparsityPrinter>
                *)this,*(uint *)(*(long *)(this + 8) + 4));
      this_00 = *(BinaryReaderBase **)this;
      (this_00->super_ReaderBase).token_ = (this_00->super_ReaderBase).ptr_;
      BinaryReaderBase::Read(this_00,8);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}